

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tests.cpp
# Opt level: O1

void __thiscall MatrixTests_SubtractMatrix_Test::TestBody(MatrixTests_SubtractMatrix_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  double sum;
  matrix<double,_3UL,_3UL> res;
  matrix<double,_3UL,_3UL> second;
  matrix<double,_3UL,_3UL> first;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  AssertHelper local_148;
  internal local_140 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  double local_130 [25];
  double local_68 [12];
  
  local_68[0] = 4.44659081257122e-323;
  local_68[1] = 1.48219693752374e-323;
  local_68[2] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_68 + lVar2) = 0x4014000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_130[0xd] = 4.44659081257122e-323;
  local_130[0xe] = 1.48219693752374e-323;
  local_130[0xf] = 1.48219693752374e-323;
  lVar2 = 0x18;
  do {
    *(undefined8 *)((long)local_130 + lVar2 + 0x68) = 0x3ff0000000000000;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_130[1] = 4.44659081257122e-323;
  lVar2 = 3;
  local_130[2] = 1.48219693752374e-323;
  local_130[3] = 1.48219693752374e-323;
  local_130[4] = 0.0;
  local_130[5] = 0.0;
  local_130[6] = 0.0;
  local_130[7] = 0.0;
  local_130[8] = 0.0;
  local_130[9] = 0.0;
  local_130[10] = 0.0;
  local_130[0xb] = 0.0;
  local_130[0xc] = 0.0;
  do {
    local_130[lVar2 + 1] = local_68[lVar2] - local_130[lVar2 + 0xd];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc);
  lVar2 = 0x18;
  local_130[0] = 0.0;
  do {
    local_130[0] = local_130[0] + *(double *)((long)local_130 + lVar2 + 8);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x60);
  local_150.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4042000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_140,"sum","4.0 * res.size()",local_130,(double *)&local_150);
  if (local_140[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_150);
    if (local_138.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_138.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/matrix_tests.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (local_150.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_150.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_150.ptr_ + 8))();
      }
      local_150.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(MatrixTests, ChainedOperations)
{
	using matrix = mcc::matrix<double, 3, 3>;
	matrix first(1.0);
	matrix second(2.0);
	matrix third(3.0);

	matrix res1 = first + second + third;
	const auto sum = std::accumulate(res1.begin(), res1.end(), 0.0);
	ASSERT_EQ(sum, (1.0 + 2.0 + 3.0) * res1.size());

	matrix res2 = first + second + third + 6.0;
	const auto sum2 = std::accumulate(res2.begin(), res2.end(), 0.0);
	ASSERT_EQ(sum2, (1.0 + 2.0 + 3.0 + 6.0) * res2.size());

	matrix res3 = first + 10.0 + second + third;
	const auto sum3 = std::accumulate(res3.begin(), res3.end(), 0.0);
	ASSERT_EQ(sum3, (1.0 + 10.0 + 2.0 + 3.0) * res3.size());

	matrix res4 = (first + second) - third;
	const auto sum4 = std::accumulate(res4.begin(), res4.end(), 0.0);
	ASSERT_EQ(sum4, 0.0);
}